

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidConvolutionNoPadding(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  ConvolutionLayerParams *pCVar8;
  ostream *poVar9;
  int iVar10;
  Result res;
  Model m1;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_48.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  this = &pAVar7->shape_;
  iVar2 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar7->shape_).current_size_;
  iVar10 = iVar2 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar2] = 3;
  iVar2 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar7->shape_).current_size_;
  iVar10 = iVar2 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar2] = 100;
  iVar2 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar2 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar2] = 100;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_48.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 100;
    pCVar8 = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(pCVar8);
    (this_01->layer_).convolution_ = pCVar8;
  }
  pCVar8 = (this_01->layer_).convolution_;
  pCVar8->outputchannels_ = 5;
  pCVar8->kernelchannels_ = 3;
  pCVar8->hasbias_ = false;
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_48);
  bVar3 = CoreML::Result::good((Result *)local_70);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x576);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return (uint)bVar3;
}

Assistant:

int testInvalidConvolutionNoPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);

    params->set_hasbias(false);

    // not specifying a padding type should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}